

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>::reject
          (AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *this,
          Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<unsigned_int> local_180;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<unsigned_int>::ExceptionOr(&local_180,false,exception_00);
    ExceptionOr<unsigned_int>::operator=(&this->result,&local_180);
    ExceptionOr<unsigned_int>::~ExceptionOr(&local_180);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }